

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

int ON_String::FormatVargsIntoBuffer
              (char *buffer,size_t buffer_capacity,char *format,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  va_list args_copy;
  
  if (buffer_capacity == 0 || buffer == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    *buffer = '\0';
    args_copy[0].reg_save_area = args->reg_save_area;
    args_copy[0].gp_offset = args->gp_offset;
    args_copy[0].fp_offset = args->fp_offset;
    args_copy[0].overflow_arg_area = args->overflow_arg_area;
    uVar1 = vsnprintf(buffer,buffer_capacity,format,args_copy);
    uVar3 = (ulong)uVar1;
    if (buffer_capacity <= (ulong)(long)(int)uVar1) {
      uVar3 = 0xffffffff;
    }
    iVar2 = (int)uVar3;
    uVar4 = 0;
    if (0 < iVar2) {
      uVar4 = uVar3;
    }
    buffer[uVar4] = '\0';
    buffer[buffer_capacity - 1] = '\0';
  }
  return iVar2;
}

Assistant:

int ON_String::FormatVargsIntoBuffer(
  char* buffer,
  size_t buffer_capacity,
  const char* format,
  va_list args
  )
{
  if (0 == buffer || buffer_capacity <= 0)
    return -1;
  buffer[0] = 0;
#if defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
  // CLang modifies args so a copy is required
  va_list args_copy;
  va_copy (args_copy, args);
#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  int len = vsnprintf(buffer, buffer_capacity, format, args_copy);
#else
  int len = vsnprintf_l(buffer, buffer_capacity, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
#endif
  va_end(args_copy);
#else
  int len = _vsprintf_p_l(buffer, buffer_capacity, format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
  if (((size_t)len) >= buffer_capacity)
    len = -1;
  buffer[(len <= 0) ? 0 : len] = 0;
  buffer[buffer_capacity - 1] = 0;
  return len;
}